

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O0

void bs_predict_vote(example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  bool bVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  int *piVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar8;
  uint temp_count;
  uint i_2;
  int tmp_label;
  uint i_1;
  uint i;
  int *pred_vec_int;
  size_type pred_vec_sz;
  bool multivote_detected;
  bool majority_found;
  int init_label;
  int current_label;
  uint counter;
  int *__last;
  int *__first;
  uint local_44;
  uint local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  int local_1c;
  int local_18;
  uint local_14;
  
  local_14 = 0;
  local_18 = 1;
  local_1c = 1;
  bVar1 = false;
  bVar3 = false;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar5);
  for (local_34 = 0; local_34 < sVar4; local_34 = local_34 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(ulong)local_34);
    dVar8 = floor(*pvVar7 + 0.5);
    piVar6[local_34] = (int)dVar8;
    if (!bVar3) {
      if (local_34 == 0) {
        local_1c = *piVar6;
        local_18 = *piVar6;
      }
      else if (((local_1c != local_18) && (piVar6[local_34] != local_18)) &&
              (piVar6[local_34] != local_1c)) {
        bVar3 = true;
      }
    }
    if (local_14 == 0) {
      local_14 = 1;
      local_18 = piVar6[local_34];
    }
    else if (piVar6[local_34] == local_18) {
      local_14 = local_14 + 1;
    }
    else {
      local_14 = local_14 + -1;
    }
  }
  if ((local_14 != 0) && (bVar3)) {
    local_14 = 0;
    for (local_38 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
        local_38 < sVar4; local_38 = local_38 + 1) {
      if (piVar6[local_38] == local_18) {
        local_14 = local_14 + 1;
      }
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    bVar1 = sVar4 < local_14 << 1;
  }
  if ((bVar3) && (!bVar1)) {
    __last = piVar6;
    __first = piVar6;
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    std::sort<int*>(__first,__last);
    local_3c = *piVar6;
    local_14 = 1;
    local_44 = 1;
    for (local_40 = 1; sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
        local_40 < sVar4; local_40 = local_40 + 1) {
      if (local_3c == piVar6[local_40]) {
        local_44 = local_44 + 1;
      }
      else {
        if (local_14 < local_44) {
          local_18 = local_3c;
          local_14 = local_44;
        }
        local_3c = piVar6[local_40];
        local_44 = 1;
      }
    }
  }
  if (piVar6 != (int *)0x0) {
    operator_delete__(piVar6);
  }
  *(float *)(in_RDI + 0x6850) = (float)local_18;
  *(float *)(in_RDI + 0x68b0) =
       (float)(~-(uint)(*(float *)(in_RDI + 0x6850) == *(float *)(in_RDI + 0x6828)) & 0x3f800000) *
       *(float *)(in_RDI + 0x6870);
  return;
}

Assistant:

void bs_predict_vote(example& ec, vector<double>& pred_vec)
{
  // majority vote in linear time
  unsigned int counter = 0;
  int current_label = 1, init_label = 1;
  // float sum_labels = 0; // uncomment for: "avg on votes" and getLoss()
  bool majority_found = false;
  bool multivote_detected = false;  // distinct(votes)>2: used to skip part of the algorithm
  auto pred_vec_sz = pred_vec.size();
  int* pred_vec_int = new int[pred_vec_sz];

  for (unsigned int i = 0; i < pred_vec_sz; i++)
  {
    pred_vec_int[i] = (int)floor(
        pred_vec[i] + 0.5);  // could be added: link(), min_label/max_label, cutoff between true/false for binary

    if (multivote_detected == false)  // distinct(votes)>2 detection bloc
    {
      if (i == 0)
      {
        init_label = pred_vec_int[i];
        current_label = pred_vec_int[i];
      }
      else if (init_label != current_label && pred_vec_int[i] != current_label && pred_vec_int[i] != init_label)
        multivote_detected = true;  // more than 2 distinct votes detected
    }

    if (counter == 0)
    {
      counter = 1;
      current_label = pred_vec_int[i];
    }
    else
    {
      if (pred_vec_int[i] == current_label)
        counter++;
      else
      {
        counter--;
      }
    }
  }

  if (counter > 0 && multivote_detected)  // remove this condition for: "avg on votes" and getLoss()
  {
    counter = 0;
    for (unsigned int i = 0; i < pred_vec.size(); i++)
      if (pred_vec_int[i] == current_label)
      {
        counter++;
        // sum_labels += pred_vec[i]; // uncomment for: "avg on votes" and getLoss()
      }
    if (counter * 2 > pred_vec.size())
      majority_found = true;
  }

  if (multivote_detected && majority_found == false)  // then find most frequent element - if tie: smallest tie label
  {
    std::sort(pred_vec_int, pred_vec_int + pred_vec.size());
    int tmp_label = pred_vec_int[0];
    counter = 1;
    for (unsigned int i = 1, temp_count = 1; i < pred_vec.size(); i++)
    {
      if (tmp_label == pred_vec_int[i])
        temp_count++;
      else
      {
        if (temp_count > counter)
        {
          current_label = tmp_label;
          counter = temp_count;
        }
        tmp_label = pred_vec_int[i];
        temp_count = 1;
      }
    }
    /* uncomment for: "avg on votes" and getLoss()
    sum_labels = 0;
    for(unsigned int i=0; i<pred_vec.size(); i++)
      if(pred_vec_int[i] == current_label)
        sum_labels += pred_vec[i]; */
  }
  // TODO: unique_ptr would also handle exception case
  delete[] pred_vec_int;

  // ld.prediction = sum_labels/(float)counter; //replace line below for: "avg on votes" and getLoss()
  ec.pred.scalar = (float)current_label;

  // ec.loss = all.loss->getLoss(all.sd, ld.prediction, ld.label) * ec.weight; //replace line below for: "avg on votes"
  // and getLoss()
  ec.loss = ((ec.pred.scalar == ec.l.simple.label) ? 0.f : 1.f) * ec.weight;
}